

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf.hpp
# Opt level: O2

pair<const_char16_t_*,_char32_t> __thiscall
pstore::utf::utf16_to_code_point<char16_t_const*,unsigned_short(*)(unsigned_short)>
          (utf *this,char16_t *first,char16_t *last,_func_unsigned_short_unsigned_short *swapper)

{
  uint uVar1;
  uint uVar2;
  utf *puVar3;
  uint uVar4;
  pair<const_char16_t_*,_char32_t> pVar5;
  
  if (this == (utf *)first) {
    assert_failed("first != last",
                  "/workspace/llm4binary/github/license_c_cmakelists/SNSystems[P]pstore/include/pstore/support/utf.hpp"
                  ,0xd7);
  }
  puVar3 = this + 2;
  uVar1 = (*(code *)last)(*(undefined2 *)this);
  if (((ushort)uVar1 & 0xfc00) == 0xd800) {
    uVar4 = 0xfffd;
    if (puVar3 != (utf *)first) {
      puVar3 = this + 4;
      uVar2 = (*(code *)last)(*(undefined2 *)(this + 2));
      if (0xfbff < (ushort)((short)uVar2 + 0x2000U)) {
        uVar4 = (uVar1 & 0x3ff) * 0x400 + (uVar2 & 0x3ff) + 0x10000;
      }
    }
  }
  else {
    uVar4 = uVar1 & 0xffff;
  }
  pVar5.second = uVar4;
  pVar5.first = (char16_t *)puVar3;
  pVar5._12_4_ = 0;
  return pVar5;
}

Assistant:

auto utf16_to_code_point (InputIterator first, InputIterator last, SwapperFunction swapper)
            -> std::pair<InputIterator, char32_t> {

            using value_type = typename std::remove_cv<
                typename std::iterator_traits<InputIterator>::value_type>::type;
            static_assert (std::is_same<value_type, char16_t>::value,
                           "iterator must produce char16_t");

            PSTORE_ASSERT (first != last);
            char32_t code_point = 0;
            char16_t const code_unit = swapper (*(first++));
            if (!is_utf16_high_surrogate (code_unit)) {
                code_point = code_unit;
            } else {
                if (first == last) {
                    code_point = replacement_char_code_point;
                } else {
                    auto const high = code_unit;
                    auto const low = swapper (*(first++));

                    if (low < 0xDC00 || low > 0xDFFF) {
                        code_point = replacement_char_code_point;
                    } else {
                        code_point = 0x10000;
                        code_point += (high & 0x03FFU) << 10U;
                        code_point += (low & 0x03FFU);
                    }
                }
            }
            return {first, code_point};
        }